

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

void __thiscall
TTD::UnorderedArrayList<int,_32UL>::AddArrayLink(UnorderedArrayList<int,_32UL> *this)

{
  int *piVar1;
  UnorderedArrayListLink *pUVar2;
  UnorderedArrayListLink *pUVar3;
  int *piVar4;
  
  pUVar3 = (UnorderedArrayListLink *)
           SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(this->m_alloc);
  piVar4 = (this->m_inlineHeadBlock).EndPos;
  piVar1 = (this->m_inlineHeadBlock).BlockData;
  pUVar2 = (this->m_inlineHeadBlock).Next;
  pUVar3->CurrPos = (this->m_inlineHeadBlock).CurrPos;
  pUVar3->EndPos = piVar4;
  pUVar3->BlockData = piVar1;
  pUVar3->Next = pUVar2;
  piVar4 = (int *)SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(this->m_alloc,0x80);
  (this->m_inlineHeadBlock).BlockData = piVar4;
  (this->m_inlineHeadBlock).CurrPos = piVar4;
  (this->m_inlineHeadBlock).EndPos = piVar4 + 0x20;
  (this->m_inlineHeadBlock).Next = pUVar3;
  return;
}

Assistant:

void AddArrayLink()
        {
            UnorderedArrayListLink* copiedOldBlock = this->m_alloc->template SlabAllocateStruct<UnorderedArrayListLink>();
            *copiedOldBlock = this->m_inlineHeadBlock;

            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = copiedOldBlock;
        }